

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCovDerive(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar1;
  int iVar2;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
      pAVar1 = Abc_NtkCo(pNtk,iVar2);
      Abc_NtkCovDeriveNode_rec
                (p,pNtkNew,(Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray],0);
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    Abc_NtkLogicMakeSimpleCos(pNtkNew,1);
    iVar2 = Abc_NtkCheck(pNtkNew);
    if (iVar2 == 0) {
      puts("Abc_NtkCovDerive: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/cov/covBuild.c"
                ,0xbc,"Abc_Ntk_t *Abc_NtkCovDerive(Cov_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDerive( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NtkCovDeriveNode_rec( p, pNtkNew, Abc_ObjFanin0(pObj), 0 );
//        printf( "*** CO %s : %d -> %d \n", Abc_ObjName(pObj), pObj->pCopy->Id, Abc_ObjFanin0(pObj)->pCopy->Id );
    }
    // add the COs
    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 1 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDerive: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}